

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

int cmSourceFileGetPropertyAsBool(void *arg,char *prop)

{
  cmSourceFile *this;
  bool bVar1;
  char *val;
  allocator local_51;
  string local_50;
  cmSourceFile *local_30;
  cmSourceFile *rsf;
  cmCPluginAPISourceFile *sf;
  char *prop_local;
  void *arg_local;
  
  this = *arg;
  local_30 = this;
  rsf = (cmSourceFile *)arg;
  sf = (cmCPluginAPISourceFile *)prop;
  prop_local = (char *)arg;
  if (this == (cmSourceFile *)0x0) {
    val = cmSourceFileGetProperty(arg,prop);
    bVar1 = cmSystemTools::IsOn(val);
    arg_local._4_4_ = (uint)bVar1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,prop,&local_51);
    bVar1 = cmSourceFile::GetPropertyAsBool(this,&local_50);
    arg_local._4_4_ = (uint)bVar1;
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return arg_local._4_4_;
}

Assistant:

int CCONV cmSourceFileGetPropertyAsBool(void *arg,const char *prop)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if(cmSourceFile* rsf = sf->RealSourceFile)
    {
    return rsf->GetPropertyAsBool(prop) ? 1:0;
    }
  else
    {
    return cmSystemTools::IsOn(cmSourceFileGetProperty(arg, prop))? 1:0;
    }
}